

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall nlohmann::detail::input_adapter::input_adapter(input_adapter *this,istream *i)

{
  shared_ptr<nlohmann::detail::input_stream_adapter> *in_RDI;
  basic_istream<char,_std::char_traits<char>_> *in_stack_00000008;
  shared_ptr<nlohmann::detail::input_adapter_protocol> *in_stack_ffffffffffffffe0;
  
  std::make_shared<nlohmann::detail::input_stream_adapter,std::istream&>(in_stack_00000008);
  std::shared_ptr<nlohmann::detail::input_adapter_protocol>::
  shared_ptr<nlohmann::detail::input_stream_adapter,void>(in_stack_ffffffffffffffe0,in_RDI);
  std::shared_ptr<nlohmann::detail::input_stream_adapter>::~shared_ptr
            ((shared_ptr<nlohmann::detail::input_stream_adapter> *)0x15176e);
  return;
}

Assistant:

input_adapter(std::istream& i)
        : ia(std::make_shared<input_stream_adapter>(i)) {}